

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

int beta_binomial_cdf_inv(double cdf,double a,double b,int c)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int local_48;
  int y;
  int x;
  double pdf;
  double cum;
  int c_local;
  double b_local;
  double a_local;
  double cdf_local;
  
  if ((0.0 <= cdf) && (cdf <= 1.0)) {
    pdf = 0.0;
    local_48 = 0;
    while( true ) {
      if (c < local_48) {
        return c;
      }
      dVar1 = r8_beta(a + (double)local_48,b + (double)(c - local_48));
      dVar2 = r8_beta((double)(local_48 + 1),(double)((c - local_48) + 1));
      dVar3 = r8_beta(a,b);
      pdf = pdf + dVar1 / ((double)(c + 1) * dVar2 * dVar3);
      if (cdf <= pdf) break;
      local_48 = local_48 + 1;
    }
    return local_48;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"BETA_BINOMIAL_CDF_INV - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  CDF < 0 or 1 < CDF.\n");
  exit(1);
}

Assistant:

int beta_binomial_cdf_inv ( double cdf, double a, double b, int c )

//****************************************************************************80
//
//  Purpose:
//
//    BETA_BINOMIAL_CDF_INV inverts the Beta Binomial CDF.
//
//  Discussion:
//
//    A simple discrete approach is used.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    03 September 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double CDF, the value of the CDF.
//
//    Input, double A, B, parameters of the PDF.
//    0.0 < A,
//    0.0 < B.
//
//    Input, int C, a parameter of the PDF.
//    0 <= C.
//
//    Output, int BETA_BINOMIAL_CDF_INV, the smallest X whose cumulative
//    density function is greater than or equal to CDF.
//
{
  double cum;
  double pdf;
  int x;
  int y;

  if ( cdf < 0.0 || 1.0 < cdf )
  {
    cerr << "\n";
    cerr << "BETA_BINOMIAL_CDF_INV - Fatal error!\n";
    cerr << "  CDF < 0 or 1 < CDF.\n";
    exit ( 1 );
  }

  cum = 0.0;

  for ( y = 0; y <= c; y++ )
  {
    pdf = r8_beta ( a + static_cast<double>(y ),
      b + static_cast<double>(c - y ) ) / ( static_cast<double>(c + 1 )
      * r8_beta ( static_cast<double>(y + 1 ),
      static_cast<double>(c - y + 1 ) ) * r8_beta ( a, b ) );

    cum = cum + pdf;

    if ( cdf <= cum )
    {
      x = y;
      return x;
    }

  }

  x = c;

  return x;
}